

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableAllTest_ResizeAndRehash_Test
          (HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableAllTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  
  HashtableAllTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ::HashtableAllTest(in_RDI);
  (in_RDI->
  super_HashtableTest<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__HashtableAllTest_ResizeAndRehash_Test_01311a38;
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeAndRehash) {
  // resize() and rehash() are synonyms.  rehash() is the tr1 name.
  TypeParam ht(10000);
  ht.max_load_factor(0.8f);  // for consistency's sake

  for (int i = 1; i < 100; ++i) ht.insert(this->UniqueObject(i));
  ht.resize(0);
  // Now ht should be as small as possible.
  EXPECT_LT(ht.bucket_count(), 300u);

  ht.rehash(9000);  // use the 'rehash' version of the name.
  // Bucket count should be next power of 2, after considering max_load_factor.
  EXPECT_EQ(16384u, ht.bucket_count());
  for (int i = 101; i < 200; ++i) ht.insert(this->UniqueObject(i));
  // Adding a few hundred buckets shouldn't have caused a resize yet.
  EXPECT_EQ(ht.bucket_count(), 16384u);
}